

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O2

agent_pending_query *
agent_query(strbuf *query,void **out,int *outlen,_func_void_void_ptr_void_ptr_int *callback,
           void *callback_ctx)

{
  _Bool _Var1;
  int fd;
  int iVar2;
  char *__s;
  size_t sVar3;
  ssize_t sVar4;
  agent_pending_query *conn;
  uint uVar5;
  ulong uVar6;
  sockaddr_un addr;
  
  __s = agent_socket_path();
  if ((__s != (char *)0x0) && (sVar3 = strlen(__s), sVar3 < 0x6c)) {
    fd = socket(1,1,0);
    if (fd < 0) {
      perror("socket(PF_UNIX)");
      exit(1);
    }
    cloexec(fd);
    addr.sun_family = 1;
    strcpy(addr.sun_path,__s);
    iVar2 = connect(fd,(sockaddr *)&addr,0x6e);
    if (-1 < iVar2) {
      strbuf_finalise_agent_query(query);
      uVar5 = 0;
      do {
        uVar6 = (ulong)uVar5;
        sVar3 = query->len - uVar6;
        if (query->len < uVar6 || sVar3 == 0) {
          conn = (agent_pending_query *)safemalloc(1,0x30,0);
          conn->fd = fd;
          conn->retbuf = conn->sizebuf;
          conn->retsize = 4;
          conn->retlen = 0;
          conn->callback = callback;
          conn->callback_ctx = callback_ctx;
          if (callback == (_func_void_void_ptr_void_ptr_int *)0x0) {
            no_nonblock(fd);
            do {
              _Var1 = agent_try_read(conn);
            } while (!_Var1);
            *out = conn->retbuf;
            *outlen = conn->retlen;
            safefree(conn);
            return (agent_pending_query *)0x0;
          }
          if (agent_pending_queries == (tree234 *)0x0) {
            agent_pending_queries = newtree234(agent_conncmp);
          }
          add234(agent_pending_queries,conn);
          uxsel_set(fd,1,agent_select_result);
          return conn;
        }
        sVar4 = write(fd,query->s + uVar6,sVar3);
        uVar5 = uVar5 + (int)sVar4;
      } while (0 < (int)sVar4);
    }
    close(fd);
  }
  *out = (void *)0x0;
  *outlen = 0;
  return (agent_pending_query *)0x0;
}

Assistant:

agent_pending_query *agent_query(
    strbuf *query, void **out, int *outlen,
    void (*callback)(void *, void *, int), void *callback_ctx)
{
    const char *name;
    int sock;
    struct sockaddr_un addr;
    int done;
    agent_pending_query *conn;

    name = agent_socket_path();
    if (!name || strlen(name) >= sizeof(addr.sun_path))
        goto failure;

    sock = socket(PF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        perror("socket(PF_UNIX)");
        exit(1);
    }

    cloexec(sock);

    addr.sun_family = AF_UNIX;
    strcpy(addr.sun_path, name);
    if (connect(sock, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        close(sock);
        goto failure;
    }

    strbuf_finalise_agent_query(query);

    for (done = 0; done < query->len ;) {
        int ret = write(sock, query->s + done,
                        query->len - done);
        if (ret <= 0) {
            close(sock);
            goto failure;
        }
        done += ret;
    }

    conn = snew(agent_pending_query);
    conn->fd = sock;
    conn->retbuf = conn->sizebuf;
    conn->retsize = 4;
    conn->retlen = 0;
    conn->callback = callback;
    conn->callback_ctx = callback_ctx;

    if (!callback) {
        /*
         * Bodge to permit making deliberately synchronous agent
         * requests. Used by Unix Pageant in command-line client mode,
         * which is legit because it really is true that no other part
         * of the program is trying to get anything useful done
         * simultaneously. But this special case shouldn't be used in
         * any more general program.
         */
        no_nonblock(conn->fd);
        while (!agent_try_read(conn))
            /* empty loop body */;

        *out = conn->retbuf;
        *outlen = conn->retlen;
        sfree(conn);
        return NULL;
    }

    /*
     * Otherwise do it properly: add conn to the tree of agent
     * connections currently in flight, return 0 to indicate that the
     * response hasn't been received yet, and call the callback when
     * select_result comes back to us.
     */
    if (!agent_pending_queries)
        agent_pending_queries = newtree234(agent_conncmp);
    add234(agent_pending_queries, conn);

    uxsel_set(sock, SELECT_R, agent_select_result);
    return conn;

    failure:
    *out = NULL;
    *outlen = 0;
    return NULL;
}